

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateTypeidMemberAccess
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,SynIdentifier *member)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TypeArgumentSet *this;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined **ppuVar4;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ExprBase *pEVar5;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  _func_int **pp_Var6;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TypeBase *pTVar7;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TypeBase *pTVar8;
  _func_int **pp_Var9;
  TypeRef *pTVar10;
  long *plVar11;
  long lVar12;
  InplaceStr *this_00;
  TypeArray *arrType;
  InplaceStr IVar13;
  InplaceStr local_40;
  undefined4 extraout_var_00;
  
  if (member == (SynIdentifier *)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
    pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar5->typeID = 1;
    pEVar5->source = source;
    pEVar5->type = pTVar7;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e68d0;
    pEVar5[1]._vptr_ExprBase = (_func_int **)type;
    return pEVar5;
  }
  if (type != (TypeBase *)0x0) {
    uVar3 = type->typeID;
    if (uVar3 == 0x18) {
      pTVar10 = type[2].refType;
      if (pTVar10 != (TypeRef *)0x0) {
        do {
          bVar1 = InplaceStr::operator==
                            ((InplaceStr *)((pTVar10->super_TypeBase)._vptr_TypeBase + 8),
                             &member->name);
          if (bVar1) goto LAB_001e5b60;
          pTVar10 = (TypeRef *)(pTVar10->super_TypeBase).name.begin;
        } while (pTVar10 != (TypeRef *)0x0);
      }
      pTVar10 = (TypeRef *)type[2].size;
      if (pTVar10 != (TypeRef *)0x0) {
        do {
          bVar1 = InplaceStr::operator==
                            ((InplaceStr *)((pTVar10->super_TypeBase)._vptr_TypeBase + 8),
                             &member->name);
          if (bVar1) goto LAB_001e5b60;
          pTVar10 = (TypeRef *)(pTVar10->super_TypeBase).name.begin;
        } while (pTVar10 != (TypeRef *)0x0);
      }
      uVar3 = type->typeID;
    }
    if ((uVar3 < 0x1a) && ((0x3130000U >> (uVar3 & 0x1f) & 1) != 0)) {
      lVar12._0_4_ = type[1].typeID;
      lVar12._4_4_ = type[1].nameHash;
      if (lVar12 != 0) {
        do {
          bVar1 = InplaceStr::operator==
                            ((InplaceStr *)(*(long *)(*(long *)(lVar12 + 8) + 0x28) + 0x40),
                             &member->name);
          if (bVar1) {
            iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar5 = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
            pTVar7 = ctx->typeTypeID;
            pTVar8 = *(TypeBase **)(*(long *)(lVar12 + 8) + 0x20);
            goto LAB_001e5ba6;
          }
          lVar12 = *(long *)(lVar12 + 0x18);
        } while (lVar12 != 0);
      }
      plVar11 = (long *)type[1].name.end;
      if (plVar11 != (long *)0x0) {
        do {
          bVar1 = InplaceStr::operator==((InplaceStr *)(*plVar11 + 0x40),&member->name);
          if (bVar1) {
            pEVar5 = CreateLiteralCopy(ctx,source,(ExprBase *)plVar11[1]);
            return pEVar5;
          }
          plVar11 = (long *)plVar11[2];
        } while (plVar11 != (long *)0x0);
      }
      local_40.begin = "hasMember";
      local_40.end = "";
      bVar1 = InplaceStr::operator==(&member->name,&local_40);
      if (bVar1) {
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar2);
        pTVar7 = ctx->typeTypeID;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (TypeArgumentSet *)CONCAT44(extraout_var_00,iVar2);
        IVar13 = GetMemberSetTypeName(ctx,type);
        TypeMemberSet::TypeMemberSet((TypeMemberSet *)this,IVar13,(TypeStruct *)type);
        goto LAB_001e5ad5;
      }
      uVar3 = type->typeID;
    }
    if ((uVar3 == 0x17) && (lVar12 = *(long *)(type[1]._vptr_TypeBase[0x18] + 0x50), lVar12 != 0)) {
      do {
        bVar1 = InplaceStr::operator==((InplaceStr *)(lVar12 + 0x40),&member->name);
        if (bVar1) {
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var_07,iVar2);
          pTVar7 = ctx->typeTypeID;
          pTVar8 = ctx->typeGeneric;
          goto LAB_001e5ba6;
        }
        lVar12 = *(long *)(lVar12 + 0x30);
      } while ((lVar12 != 0) && (*(int *)(lVar12 + 8) == 4));
    }
  }
  this_00 = &member->name;
  local_40.begin = "isReference";
  local_40.end = "";
  bVar1 = InplaceStr::operator==(this_00,&local_40);
  if (bVar1) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_04,iVar2);
    pTVar7 = ctx->typeBool;
    if (type != (TypeBase *)0x0) {
      bVar1 = type->typeID == 0x12;
      goto LAB_001e5d2c;
    }
  }
  else {
    local_40.begin = "isArray";
    local_40.end = "";
    bVar1 = InplaceStr::operator==(this_00,&local_40);
    if (bVar1) {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var_05,iVar2);
      pTVar7 = ctx->typeBool;
      if (type != (TypeBase *)0x0) {
        bVar1 = true;
        if (type->typeID != 0x13) {
          bVar1 = type->typeID == 0x14;
        }
        goto LAB_001e5d2c;
      }
    }
    else {
      local_40.begin = "isFunction";
      local_40.end = "";
      bVar1 = InplaceStr::operator==(this_00,&local_40);
      if (!bVar1) {
        local_40.begin = "arraySize";
        local_40.end = "";
        bVar1 = InplaceStr::operator==(this_00,&local_40);
        if (bVar1) {
          if (type != (TypeBase *)0x0) {
            uVar3 = type->typeID;
            if (uVar3 == 0x14) {
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar5 = (ExprBase *)CONCAT44(extraout_var_10,iVar2);
              pTVar7 = ctx->typeInt;
              pEVar5->typeID = 6;
              pEVar5->source = source;
              pEVar5->type = pTVar7;
              pEVar5->next = (ExprBase *)0x0;
              pEVar5->listed = false;
              pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
              pEVar5[1]._vptr_ExprBase = (_func_int **)0xffffffffffffffff;
              return pEVar5;
            }
            if (uVar3 == 0x13) {
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar5 = (ExprBase *)CONCAT44(extraout_var_09,iVar2);
              pTVar7 = ctx->typeInt;
              pTVar8 = *(TypeBase **)&type[1].typeID;
              pEVar5->typeID = 6;
              pEVar5->source = source;
              pEVar5->type = pTVar7;
              pEVar5->next = (ExprBase *)0x0;
              pEVar5->listed = false;
              ppuVar4 = &PTR__ExprBase_003e63c8;
              goto LAB_001e5bcf;
            }
            if (uVar3 == 0) goto LAB_001e620e;
          }
          anon_unknown.dwarf_1117a3::Report
                    (ctx,source,
                     "ERROR: \'arraySize\' can only be applied to an array type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "size";
        local_40.end = "";
        bVar1 = InplaceStr::operator==(this_00,&local_40);
        if (bVar1) {
          if (type != (TypeBase *)0x0) {
            if (type->typeID == 0x1b) {
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar5 = (ExprBase *)CONCAT44(extraout_var_08,iVar2);
              pTVar7 = ctx->typeInt;
              pp_Var9 = type[1]._vptr_TypeBase;
              pp_Var6 = (_func_int **)0x0;
              if (pp_Var9 != (_func_int **)0x0) {
                do {
                  uVar3 = (int)pp_Var6 + 1;
                  pp_Var6 = (_func_int **)(ulong)uVar3;
                  pp_Var9 = (_func_int **)pp_Var9[1];
                } while (pp_Var9 != (_func_int **)0x0);
                pp_Var6 = (_func_int **)(ulong)uVar3;
              }
              pEVar5->typeID = 6;
              pEVar5->source = source;
              pEVar5->type = pTVar7;
              pEVar5->next = (ExprBase *)0x0;
              pEVar5->listed = false;
              pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
              pEVar5[1]._vptr_ExprBase = pp_Var6;
              return pEVar5;
            }
            if (type->typeID == 0) goto LAB_001e620e;
          }
          anon_unknown.dwarf_1117a3::Report
                    (ctx,source,
                     "ERROR: \'size\' can only be applied to a function type, but we have \'%.*s\'",
                     (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "argument";
        local_40.end = "";
        bVar1 = InplaceStr::operator==(this_00,&local_40);
        if (bVar1) {
          if (type != (TypeBase *)0x0) {
            if (type->typeID == 0x15) {
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar5 = (ExprBase *)CONCAT44(extraout_var_11,iVar2);
              pTVar7 = ctx->typeTypeID;
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
              this = (TypeArgumentSet *)CONCAT44(extraout_var_12,iVar2);
              IVar13 = GetArgumentSetTypeName(ctx,*(IntrusiveList<TypeHandle> *)&type[1].typeID);
              TypeArgumentSet::TypeArgumentSet
                        (this,IVar13,*(IntrusiveList<TypeHandle> *)&type[1].typeID);
LAB_001e5ad5:
              pEVar5->typeID = 8;
              pEVar5->source = source;
              pEVar5->type = pTVar7;
              pEVar5->next = (ExprBase *)0x0;
              pEVar5->listed = false;
              pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
              pEVar5[1]._vptr_ExprBase = (_func_int **)this;
              return pEVar5;
            }
            if (type->typeID == 0) goto LAB_001e620e;
          }
          anon_unknown.dwarf_1117a3::Report
                    (ctx,source,
                     "ERROR: \'argument\' can only be applied to a function type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "return";
        local_40.end = "";
        bVar1 = InplaceStr::operator==(this_00,&local_40);
        if (bVar1) {
          if (type == (TypeBase *)0x0) {
LAB_001e5ef3:
            anon_unknown.dwarf_1117a3::Report
                      (ctx,source,
                       "ERROR: \'return\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
            goto LAB_001e5f12;
          }
          if (type->typeID != 0x15) {
            if (type->typeID == 0) goto LAB_001e620e;
            goto LAB_001e5ef3;
          }
          goto LAB_001e612b;
        }
LAB_001e5f12:
        local_40.begin = "target";
        local_40.end = "";
        bVar1 = InplaceStr::operator==(this_00,&local_40);
        if (bVar1) {
          if (type != (TypeBase *)0x0) {
            uVar3 = type->typeID;
            if ((int)uVar3 < 0x13) {
              if (uVar3 == 0) goto LAB_001e620e;
              if (uVar3 == 0x12) goto LAB_001e612b;
            }
            else {
              if (uVar3 == 0x13) {
LAB_001e612b:
                iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                pEVar5 = (ExprBase *)CONCAT44(extraout_var_14,iVar2);
                pTVar7 = ctx->typeTypeID;
                pTVar8 = (TypeBase *)type[1]._vptr_TypeBase;
                goto LAB_001e5ba6;
              }
              if (uVar3 == 0x14) {
                iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                pEVar5 = (ExprBase *)CONCAT44(extraout_var_13,iVar2);
                pTVar7 = ctx->typeTypeID;
                pTVar8 = *(TypeBase **)&type[1].typeIndex;
                goto LAB_001e5ba6;
              }
            }
          }
          anon_unknown.dwarf_1117a3::Report
                    (ctx,source,
                     "ERROR: \'target\' can only be applied to a pointer or array type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "first";
        local_40.end = "";
        bVar1 = InplaceStr::operator==(this_00,&local_40);
        if (bVar1) {
          if (type == (TypeBase *)0x0) {
LAB_001e61ab:
            anon_unknown.dwarf_1117a3::Report
                      (ctx,source,
                       "ERROR: \'first\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
            goto LAB_001e61ca;
          }
          if (type->typeID != 0x1b) {
            if (type->typeID == 0) goto LAB_001e620e;
            goto LAB_001e61ab;
          }
          if (type[1]._vptr_TypeBase == (_func_int **)0x0) goto LAB_001e6300;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var_16,iVar2);
          pTVar7 = ctx->typeTypeID;
          pp_Var9 = type[1]._vptr_TypeBase;
        }
        else {
LAB_001e61ca:
          local_40.begin = "last";
          local_40.end = "";
          bVar1 = InplaceStr::operator==(this_00,&local_40);
          if (!bVar1) {
            return (ExprBase *)0x0;
          }
          if (type == (TypeBase *)0x0) {
LAB_001e6281:
            anon_unknown.dwarf_1117a3::Report
                      (ctx,source,
                       "ERROR: \'last\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
            return (ExprBase *)0x0;
          }
          if (type->typeID != 0x1b) {
            if (type->typeID == 0) {
LAB_001e620e:
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
              pEVar5 = (ExprBase *)CONCAT44(extraout_var_15,iVar2);
              pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
              pEVar5->typeID = 0;
              pEVar5->source = source;
              pEVar5->type = pTVar7;
              pEVar5->next = (ExprBase *)0x0;
              pEVar5->listed = false;
              pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003e6630;
              pEVar5[2]._vptr_ExprBase = (_func_int **)0x0;
              pEVar5[1]._vptr_ExprBase = (_func_int **)&pEVar5[1].source;
              *(undefined8 *)&pEVar5[1].typeID = 0x400000000;
              return pEVar5;
            }
            goto LAB_001e6281;
          }
          if (type[1]._vptr_TypeBase == (_func_int **)0x0) {
LAB_001e6300:
            anon_unknown.dwarf_1117a3::Report(ctx,source,"ERROR: function argument set is empty");
            return (ExprBase *)0x0;
          }
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var_17,iVar2);
          pTVar7 = ctx->typeTypeID;
          pp_Var9 = *(_func_int ***)&type[1].typeID;
        }
        pTVar8 = (TypeBase *)*pp_Var9;
        goto LAB_001e5ba6;
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var_06,iVar2);
      pTVar7 = ctx->typeBool;
      if (type != (TypeBase *)0x0) {
        bVar1 = type->typeID == 0x15;
        goto LAB_001e5d2c;
      }
    }
  }
  bVar1 = false;
LAB_001e5d2c:
  pEVar5->typeID = 3;
  pEVar5->source = source;
  pEVar5->type = pTVar7;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6358;
  pEVar5->field_0x29 = bVar1;
  return pEVar5;
LAB_001e5b60:
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar5 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
  pTVar7 = ctx->typeTypeID;
  pTVar8 = *(TypeBase **)&(pTVar10->super_TypeBase).typeID;
LAB_001e5ba6:
  pEVar5->typeID = 8;
  pEVar5->source = source;
  pEVar5->type = pTVar7;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  ppuVar4 = &PTR__ExprBase_003e6550;
LAB_001e5bcf:
  pEVar5->_vptr_ExprBase = (_func_int **)ppuVar4;
  pEVar5[1]._vptr_ExprBase = (_func_int **)pTVar8;
  return pEVar5;
}

Assistant:

ExprBase* CreateTypeidMemberAccess(ExpressionContext &ctx, SynBase *source, TypeBase *type, SynIdentifier *member)
{
	if(!member)
		return new (ctx.get<ExprErrorTypeMemberAccess>()) ExprErrorTypeMemberAccess(source, ctx.GetErrorType(), type);

	if(TypeClass *classType = getType<TypeClass>(type))
	{
		for(MatchData *curr = classType->aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name== member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}

		for(MatchData *curr = classType->generics.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}
	}

	if(TypeStruct *structType = getType<TypeStruct>(type))
	{
		for(MemberHandle *curr = structType->members.head; curr; curr = curr->next)
		{
			if(curr->variable->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->variable->type);
		}

		for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return CreateLiteralCopy(ctx, source, curr->value);
		}

		if(member->name == InplaceStr("hasMember"))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeMemberSet>()) TypeMemberSet(GetMemberSetTypeName(ctx, structType), structType));
	}

	if(TypeGenericClass *typeGenericClass = getType<TypeGenericClass>(type))
	{
		for(SynIdentifier *curr = typeGenericClass->proto->definition->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(curr->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, ctx.typeGeneric);
		}
	}

	if(member->name == InplaceStr("isReference"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeRef>(type));
	}

	if(member->name == InplaceStr("isArray"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeArray>(type) || isType<TypeUnsizedArray>(type));
	}

	if(member->name == InplaceStr("isFunction"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeFunction>(type));
	}

	if(member->name == InplaceStr("arraySize"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, arrType->length);

		if(isType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, -1);

		Report(ctx, source, "ERROR: 'arraySize' can only be applied to an array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("size"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, argumentsType->types.size());

		Report(ctx, source, "ERROR: 'size' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("argument"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeArgumentSet>()) TypeArgumentSet(GetArgumentSetTypeName(ctx, functionType->arguments), functionType->arguments));

		Report(ctx, source, "ERROR: 'argument' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("return"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, functionType->returnType);

		Report(ctx, source, "ERROR: 'return' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("target"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeRef *refType = getType<TypeRef>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, refType->subType);

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		if(TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		Report(ctx, source, "ERROR: 'target' can only be applied to a pointer or array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("first"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.head->type);
		}

		Report(ctx, source, "ERROR: 'first' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("last"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.tail->type);
		}

		Report(ctx, source, "ERROR: 'last' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	return NULL;
}